

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O1

ssize_t kvtree_write_attempt(char *file,int fd,void *buf,size_t size)

{
  uint __errnum;
  ssize_t sVar1;
  uint *puVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  int local_3c;
  
  if (size == 0) {
    uVar4 = 0;
  }
  else {
    local_3c = 10;
    uVar4 = 0;
    do {
      sVar1 = write(fd,(void *)((long)buf + uVar4),size - uVar4);
      if (sVar1 < 1) {
        if (sVar1 == 0) {
          kvtree_err("Error writing file %s write returned 0 @ %s:%d",file,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                     ,0x135);
LAB_00106872:
          bVar5 = true;
        }
        else {
          puVar2 = (uint *)__errno_location();
          __errnum = *puVar2;
          bVar5 = false;
          if ((__errnum != 4) && (__errnum != 0xb)) {
            pcVar3 = strerror(__errnum);
            local_3c = local_3c + -1;
            if (local_3c == 0) {
              local_3c = 0;
              kvtree_err("Giving up write of file %s errno=%d %s @ %s:%d",file,(ulong)__errnum,
                         pcVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                         ,0x148);
              goto LAB_00106872;
            }
            bVar5 = false;
            kvtree_err("Error writing file %s errno=%d %s @ %s:%d",file,(ulong)__errnum,pcVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                       ,0x143);
          }
        }
      }
      else {
        uVar4 = uVar4 + sVar1;
        bVar5 = false;
      }
      if (bVar5) {
        return -1;
      }
    } while (uVar4 < size);
  }
  return uVar4;
}

Assistant:

ssize_t kvtree_write_attempt(const char* file, int fd, const void* buf, size_t size)
{
  ssize_t n = 0;
  int retries = 10;
  while (n < size)
  {
    ssize_t rc = write(fd, (char*) buf + n, size - n);
    if (rc > 0) {
      n += rc;
    } else if (rc == 0) {
      /* something bad happened, print an error and abort */
      kvtree_err("Error writing file %s write returned 0 @ %s:%d",
        file, __FILE__, __LINE__
      );
      return -1;
    } else { /* (rc < 0) */
      /* got an error, check whether it was serious */
      if (errno == EINTR || errno == EAGAIN) {
        continue;
      }

      /* something worth printing an error about */
      retries--;
      if (retries) {
        /* print an error and try again */
        kvtree_err("Error writing file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
      } else {
        /* too many failed retries, give up */
        kvtree_err("Giving up write of file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
        return -1;
      }
    }
  }
  return n;
}